

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmlookup.cpp
# Opt level: O2

void __thiscall CVmObjLookupTable::load_image_data(CVmObjLookupTable *this,char *ptr,size_t siz)

{
  ushort uVar1;
  vm_lookup_ext *pvVar2;
  vm_lookup_val *pvVar3;
  vm_lookup_val *pvVar4;
  vm_lookup_val **ppvVar5;
  uint value_cnt;
  char *buf;
  vm_val_t *val;
  bool bVar6;
  
  if ((this->super_CVmObjCollection).super_CVmObject.ext_ != (char *)0x0) {
    (*G_mem_X->varheap_->_vptr_CVmVarHeap[6])();
  }
  uVar1 = *(ushort *)ptr;
  value_cnt = (uint)*(ushort *)(ptr + 2);
  pvVar2 = vm_lookup_ext::alloc_ext(this,(uint)uVar1,value_cnt);
  (this->super_CVmObjCollection).super_CVmObject.ext_ = (char *)pvVar2;
  pvVar3 = (vm_lookup_val *)0x0;
  pvVar4 = (vm_lookup_val *)(pvVar2[*(ushort *)(ptr + 4) - 1].buckets + pvVar2->bucket_cnt);
  if (*(ushort *)(ptr + 4) == 0) {
    pvVar4 = pvVar3;
  }
  pvVar2->first_free = pvVar4;
  buf = ptr + 0xb;
  for (; (uint)uVar1 != (uint)pvVar3; pvVar3 = (vm_lookup_val *)((long)&(pvVar3->key).typ + 1)) {
    pvVar4 = (vm_lookup_val *)0x0;
    if (*(ushort *)(buf + -5) != 0) {
      pvVar4 = (vm_lookup_val *)(pvVar2[*(ushort *)(buf + -5) - 1].buckets + pvVar2->bucket_cnt);
    }
    pvVar2->buckets[(long)pvVar3] = pvVar4;
    buf = buf + 2;
  }
  val = (vm_val_t *)(pvVar2->buckets + pvVar2->bucket_cnt);
  while( true ) {
    bVar6 = value_cnt == 0;
    value_cnt = value_cnt - 1;
    if (bVar6) break;
    vmb_get_dh(buf + -5,val);
    vmb_get_dh(buf,val + 1);
    ppvVar5 = pvVar2[*(ushort *)(buf + 5) - 1].buckets + pvVar2->bucket_cnt;
    if (*(ushort *)(buf + 5) == 0) {
      ppvVar5 = (vm_lookup_val **)0x0;
    }
    *(vm_lookup_val ***)(val + 2) = ppvVar5;
    buf = buf + 0xc;
    val = (vm_val_t *)&val[2].val;
  }
  (pvVar2->default_value).typ = VM_NIL;
  if (ptr + siz < buf) {
    return;
  }
  vmb_get_dh(buf + -5,&pvVar2->default_value);
  return;
}

Assistant:

void CVmObjLookupTable::load_image_data(VMG_ const char *ptr, size_t siz)
{
    uint bucket_cnt;
    uint val_cnt;
    uint i;
    const char *ibp;
    vm_lookup_val **ebp;
    vm_lookup_val *eval;
    vm_lookup_ext *ext;

    /* free our existing extension, if we have one */
    if (ext_ != 0)
        G_mem->get_var_heap()->free_mem(ext_);

    /* read the bucket and value counts from the header */
    bucket_cnt = osrp2(ptr);
    val_cnt = osrp2(ptr + 2);

    /* allocate space for a copy of the image data */
    ext = vm_lookup_ext::alloc_ext(vmg_ this, bucket_cnt, val_cnt);
    ext_ = (char *)ext;

    /* initialize the free list pointer, given as a 1-based entry index */
    ext->first_free = ext->img_idx_to_val(osrp2(ptr + 4));

    /* initialize the table from the load image data */
    for (i = bucket_cnt, ibp = ptr + 6, ebp = ext->buckets ;
         i != 0 ; --i, ibp += 2, ++ebp)
    {
        /* translate the image file index to a value pointer */
        *ebp = ext->img_idx_to_val(osrp2(ibp));
    }

    /* initialize the value entries */
    for (i = val_cnt, eval = ext->idx_to_val(0) ;
         i != 0 ; --i, ibp += VMLOOKUP_VALUE_SIZE, ++eval)
    {
        /* read the key and value */
        vmb_get_dh(ibp, &eval->key);
        vmb_get_dh(ibp + VMB_DATAHOLDER, &eval->val);

        /* remember the next pointer, which is given as a 1-based index */
        eval->nxt = ext->img_idx_to_val(osrp2(ibp + VMB_DATAHOLDER*2));
    }

    /* if a default value is included, read it */
    ext->default_value.set_nil();
    if (ibp + VMB_DATAHOLDER <= ptr + siz)
    {
        /* read the default value and skip it in the source data */
        vmb_get_dh(ibp, &ext->default_value);
        ibp += VMB_DATAHOLDER;
    }
}